

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
kj::Vector<kj::_::XThreadEvent_*>::setCapacity(Vector<kj::_::XThreadEvent_*> *this,size_t newSize)

{
  XThreadEvent **ppXVar1;
  XThreadEvent **ppXVar2;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar3;
  XThreadEvent **__dest;
  ulong __n;
  ArrayBuilder<kj::_::XThreadEvent_*> newBuilder;
  ArrayBuilder<kj::_::XThreadEvent_*> local_38;
  
  ppXVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppXVar1 >> 3)) {
    (this->builder).pos = ppXVar1 + newSize;
  }
  __dest = (XThreadEvent **)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  ppXVar1 = (this->builder).ptr;
  ppXVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (ppXVar1 != ppXVar2) {
    __n = (long)ppXVar2 - (long)ppXVar1 & 0xfffffffffffffff8;
    local_38.pos = __dest;
    memcpy(__dest,ppXVar1,__n);
    __dest = (XThreadEvent **)((long)__dest + __n);
  }
  local_38.pos = __dest;
  ArrayBuilder<kj::_::XThreadEvent_*>::operator=(&this->builder,&local_38);
  ppXVar2 = local_38.endPtr;
  ppXVar3 = local_38.pos;
  ppXVar1 = local_38.ptr;
  if (local_38.ptr != (XThreadEvent **)0x0) {
    local_38.ptr = (XThreadEvent **)0x0;
    local_38.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
    local_38.endPtr = (XThreadEvent **)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,ppXVar1,8,(long)ppXVar3 - (long)ppXVar1 >> 3,
               (long)ppXVar2 - (long)ppXVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }